

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O0

float __thiscall trackerboy::Module::framerate(Module *this)

{
  Module *this_local;
  
  if (this->mSystem == dmg) {
    this_local._4_4_ = 59.7;
  }
  else if (this->mSystem == sgb) {
    this_local._4_4_ = 61.1;
  }
  else {
    this_local._4_4_ = (float)this->mCustomFramerate;
  }
  return this_local._4_4_;
}

Assistant:

float Module::framerate() const noexcept {
    switch (mSystem) {
        case System::dmg:
            return GB_FRAMERATE_DMG;
        case System::sgb:
            return GB_FRAMERATE_SGB;
        default:
            return (float)mCustomFramerate;
    }
}